

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

void __thiscall
MCTS::Node<GoState<3U,_3U>_>::Node
          (Node<GoState<3U,_3U>_> *this,GoState<3U,_3U> *state,Move *move_,
          Node<GoState<3U,_3U>_> *parent_)

{
  undefined8 in_RCX;
  undefined4 *in_RDX;
  long *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = *in_RDX;
  *(undefined8 *)(in_RDI + 2) = in_RCX;
  in_RDI[4] = *(undefined4 *)((long)in_RSI + 0x4c);
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[8] = 0;
  (**(code **)(*in_RSI + 0x60))(in_RDI + 10);
  std::vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>::
  vector((vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_> *)
         0x1b9139);
  *(undefined8 *)(in_RDI + 0x16) = 0;
  return;
}

Assistant:

Node<State>::Node(const State& state, const Move& move_, Node* parent_) :
	move(move_),
	parent(parent_),
	player_to_move(state.player_to_move),
	wins(0),
	visits(0),
	moves(state.get_moves()),
	UCT_score(0)
{ }